

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.h
# Opt level: O2

LogStream * __thiscall LogStream::operator<<(LogStream *this,char *str)

{
  char **ppcVar1;
  char *pcVar2;
  int iVar3;
  long lStack_8;
  
  ppcVar1 = &(this->buffer_).cur_;
  pcVar2 = (this->buffer_).cur_;
  iVar3 = (int)ppcVar1 - (int)pcVar2;
  if (str == (char *)0x0) {
    if (iVar3 < 10) {
      return this;
    }
    builtin_strncpy(pcVar2,"(nullptr)",9);
    lStack_8 = 9;
  }
  else {
    if (iVar3 < 9) {
      return this;
    }
    *(undefined8 *)pcVar2 = *(undefined8 *)str;
    lStack_8 = 8;
  }
  *ppcVar1 = *ppcVar1 + lStack_8;
  return this;
}

Assistant:

LogStream& operator<<(const char* str){
        if(str){
            buffer_.append(str, sizeof(str));
        }else {
            buffer_.append("(nullptr)", 9);
        }
        return *this;
    }